

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O0

bool __thiscall clickhouse::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64_t *value)

{
  bool bVar1;
  ulong *in_RSI;
  InputStream *in_RDI;
  uint8_t byte;
  size_t i;
  uint8_t *in_stack_ffffffffffffffc8;
  byte local_21;
  ulong local_20;
  
  *in_RSI = 0;
  local_20 = 0;
  while( true ) {
    if (9 < local_20) {
      return false;
    }
    bVar1 = InputStream::ReadByte(in_RDI,in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    *in_RSI = (long)(int)(local_21 & 0x7f) << ((char)local_20 * '\a' & 0x3fU) | *in_RSI;
    if ((local_21 & 0x80) == 0) {
      return true;
    }
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool CodedInputStream::ReadVarint64(uint64_t* value) {
    *value = 0;

    for (size_t i = 0; i < MAX_VARINT_BYTES; ++i) {
        uint8_t byte;

        if (!input_->ReadByte(&byte)) {
            return false;
        } else {
            *value |= uint64_t(byte & 0x7F) << (7 * i);

            if (!(byte & 0x80)) {
                return true;
            }
        }
    }

    // TODO skip invalid
    return false;
}